

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_page_search_root(MDB_cursor *mc,MDB_val *key,int flags)

{
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  MDB_node *pMVar4;
  int in_R8D;
  uint uVar5;
  ulong uVar6;
  MDB_page *pMVar7;
  int exact;
  MDB_page *mp;
  int local_3c;
  MDB_page *local_38;
  
  pMVar7 = mc->mc_pg[mc->mc_top];
  local_38 = pMVar7;
  do {
    if ((pMVar7->mp_flags & 1) == 0) {
      if ((pMVar7->mp_flags & 2) == 0) {
        puVar1 = &mc->mc_txn->mt_flags;
        *puVar1 = *puVar1 | 2;
        iVar3 = -0x784c;
      }
      else {
        mc->mc_flags = (mc->mc_flags & 0xfffffffc) + 1;
        iVar3 = 0;
      }
      return iVar3;
    }
    if ((mc->mc_dbi != 0) && (((pMVar7->mp_pb).pb.pb_lower & 0xfffc) == 0x10)) {
      mdb_assert_fail(mc->mc_txn->mt_env,"!mc->mc_dbi || NUMKEYS(mp) > 1","mdb_page_search_root",
                      (char *)0x1789,in_R8D);
    }
    if ((flags & 0xcU) == 0) {
      pMVar4 = mdb_node_search(mc,key,&local_3c);
      if (pMVar4 == (MDB_node *)0x0) goto LAB_0010bbd3;
      uVar2 = mc->mc_ki[mc->mc_top];
      uVar6 = (ulong)uVar2;
      uVar5 = (uint)uVar2;
      if (local_3c != 0) goto LAB_0010bbe5;
      if (uVar2 == 0) {
        mdb_assert_fail(mc->mc_txn->mt_env,"i > 0","mdb_page_search_root",(char *)0x1798,in_R8D);
      }
LAB_0010bbe2:
      uVar6 = (ulong)(uVar5 - 1);
    }
    else {
      if ((flags & 8U) != 0) {
LAB_0010bbd3:
        uVar5 = (pMVar7->mp_pb).pb.pb_lower + 0x1fff0 >> 1;
        goto LAB_0010bbe2;
      }
      uVar6 = 0;
    }
LAB_0010bbe5:
    if ((pMVar7->mp_pb).pb.pb_lower - 0x10 >> 1 <= (uint)(uVar6 & 0xffff)) {
      mdb_assert_fail(mc->mc_txn->mt_env,"i < NUMKEYS(mp)","mdb_page_search_root",(char *)0x179f,
                      in_R8D);
    }
    iVar3 = mdb_page_get(mc,(ulong)CONCAT24(*(undefined2 *)
                                             ((long)pMVar7->mp_ptrs +
                                             ((ulong)pMVar7->mp_ptrs[uVar6 & 0xffff] - 0xc)),
                                            *(undefined4 *)
                                             ((long)pMVar7->mp_ptrs +
                                             ((ulong)pMVar7->mp_ptrs[uVar6 & 0xffff] - 0x10))),
                         &local_38,(int *)0x0);
    pMVar7 = local_38;
    if (iVar3 != 0) {
      return iVar3;
    }
    mc->mc_ki[mc->mc_top] = (indx_t)uVar6;
    iVar3 = mdb_cursor_push(mc,local_38);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((flags & 1U) != 0) {
      iVar3 = mdb_page_touch(mc);
      if (iVar3 != 0) {
        return iVar3;
      }
      pMVar7 = mc->mc_pg[mc->mc_top];
      local_38 = pMVar7;
    }
  } while( true );
}

Assistant:

static int
mdb_page_search_root(MDB_cursor *mc, MDB_val *key, int flags)
{
	MDB_page	*mp = mc->mc_pg[mc->mc_top];
	int rc;
	DKBUF;

	while (IS_BRANCH(mp)) {
		MDB_node	*node;
		indx_t		i;

		DPRINTF(("branch page %"Y"u has %u keys", mp->mp_pgno, NUMKEYS(mp)));
		/* Don't assert on branch pages in the FreeDB. We can get here
		 * while in the process of rebalancing a FreeDB branch page; we must
		 * let that proceed. ITS#8336
		 */
		mdb_cassert(mc, !mc->mc_dbi || NUMKEYS(mp) > 1);
		DPRINTF(("found index 0 to page %"Y"u", NODEPGNO(NODEPTR(mp, 0))));

		if (flags & (MDB_PS_FIRST|MDB_PS_LAST)) {
			i = 0;
			if (flags & MDB_PS_LAST)
				i = NUMKEYS(mp) - 1;
		} else {
			int	 exact;
			node = mdb_node_search(mc, key, &exact);
			if (node == NULL)
				i = NUMKEYS(mp) - 1;
			else {
				i = mc->mc_ki[mc->mc_top];
				if (!exact) {
					mdb_cassert(mc, i > 0);
					i--;
				}
			}
			DPRINTF(("following index %u for key [%s]", i, DKEY(key)));
		}

		mdb_cassert(mc, i < NUMKEYS(mp));
		node = NODEPTR(mp, i);

		if ((rc = mdb_page_get(mc, NODEPGNO(node), &mp, NULL)) != 0)
			return rc;

		mc->mc_ki[mc->mc_top] = i;
		if ((rc = mdb_cursor_push(mc, mp)))
			return rc;

		if (flags & MDB_PS_MODIFY) {
			if ((rc = mdb_page_touch(mc)) != 0)
				return rc;
			mp = mc->mc_pg[mc->mc_top];
		}
	}

	if (!IS_LEAF(mp)) {
		DPRINTF(("internal error, index points to a %02X page!?",
		    mp->mp_flags));
		mc->mc_txn->mt_flags |= MDB_TXN_ERROR;
		return MDB_CORRUPTED;
	}

	DPRINTF(("found leaf page %"Y"u for key [%s]", mp->mp_pgno,
	    key ? DKEY(key) : "null"));
	mc->mc_flags |= C_INITIALIZED;
	mc->mc_flags &= ~C_EOF;

	return MDB_SUCCESS;
}